

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall duckdb::ART::CommitDrop(ART *this,IndexLock *index_lock)

{
  type paVar1;
  long lVar2;
  
  paVar1 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&this->allocators);
  lVar2 = 0;
  do {
    FixedSizeAllocator::Reset
              (*(FixedSizeAllocator **)
                ((long)&paVar1->_M_elems[0].
                        super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> + lVar2));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x48);
  (this->tree).super_IndexPointer.data = 0;
  return;
}

Assistant:

void ART::CommitDrop(IndexLock &index_lock) {
	for (auto &allocator : *allocators) {
		allocator->Reset();
	}
	tree.Clear();
}